

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Index * sqlite3AllocateIndexObject(sqlite3 *db,i16 nCol,int nExtra,char **ppExtra)

{
  Index *pIVar1;
  undefined6 in_register_00000032;
  int iVar2;
  long lVar3;
  i16 *piVar4;
  
  iVar2 = (int)CONCAT62(in_register_00000032,nCol);
  lVar3 = (long)iVar2;
  iVar2 = (iVar2 * 5 + 9U & 0xfffffff8) + iVar2 * 8 + 0x98;
  pIVar1 = (Index *)sqlite3DbMallocZero(db,(long)(nExtra + iVar2));
  if (pIVar1 != (Index *)0x0) {
    pIVar1->azColl = &pIVar1[1].zName;
    pIVar1->aiRowLogEst = (LogEst *)(&pIVar1[1].zName + lVar3);
    piVar4 = (i16 *)((long)(&pIVar1[1].zName + lVar3) + (lVar3 + 1) * 2);
    pIVar1->aiColumn = piVar4;
    pIVar1->aSortOrder = (u8 *)(piVar4 + lVar3);
    pIVar1->nColumn = nCol;
    pIVar1->nKeyCol = nCol - 1;
    *ppExtra = (char *)((long)&pIVar1->zName + (long)iVar2);
  }
  return pIVar1;
}

Assistant:

SQLITE_PRIVATE Index *sqlite3AllocateIndexObject(
  sqlite3 *db,         /* Database connection */
  i16 nCol,            /* Total number of columns in the index */
  int nExtra,          /* Number of bytes of extra space to alloc */
  char **ppExtra       /* Pointer to the "extra" space */
){
  Index *p;            /* Allocated index object */
  int nByte;           /* Bytes of space for Index object + arrays */

  nByte = ROUND8(sizeof(Index)) +              /* Index structure  */
          ROUND8(sizeof(char*)*nCol) +         /* Index.azColl     */
          ROUND8(sizeof(LogEst)*(nCol+1) +     /* Index.aiRowLogEst   */
                 sizeof(i16)*nCol +            /* Index.aiColumn   */
                 sizeof(u8)*nCol);             /* Index.aSortOrder */
  p = sqlite3DbMallocZero(db, nByte + nExtra);
  if( p ){
    char *pExtra = ((char*)p)+ROUND8(sizeof(Index));
    p->azColl = (const char**)pExtra; pExtra += ROUND8(sizeof(char*)*nCol);
    p->aiRowLogEst = (LogEst*)pExtra; pExtra += sizeof(LogEst)*(nCol+1);
    p->aiColumn = (i16*)pExtra;       pExtra += sizeof(i16)*nCol;
    p->aSortOrder = (u8*)pExtra;
    p->nColumn = nCol;
    p->nKeyCol = nCol - 1;
    *ppExtra = ((char*)p) + nByte;
  }
  return p;
}